

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O3

int it_read_pattern(IT_PATTERN *pattern,DUMBFILE *f,uchar *buffer)

{
  uchar uVar1;
  int n;
  int iVar2;
  IT_ENTRY *pIVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uchar cmask [64];
  uchar ceffectvalue [64];
  uchar ceffect [64];
  uchar cvolpan [64];
  uchar cinstrument [64];
  uchar cnote [64];
  byte local_1a8 [64];
  uchar local_168 [320];
  
  local_1a8[0] = 0;
  local_1a8[1] = 0;
  local_1a8[2] = 0;
  local_1a8[3] = 0;
  local_1a8[4] = 0;
  local_1a8[5] = 0;
  local_1a8[6] = 0;
  local_1a8[7] = 0;
  local_1a8[8] = 0;
  local_1a8[9] = 0;
  local_1a8[10] = 0;
  local_1a8[0xb] = 0;
  local_1a8[0xc] = 0;
  local_1a8[0xd] = 0;
  local_1a8[0xe] = 0;
  local_1a8[0xf] = 0;
  local_1a8[0x10] = 0;
  local_1a8[0x11] = 0;
  local_1a8[0x12] = 0;
  local_1a8[0x13] = 0;
  local_1a8[0x14] = 0;
  local_1a8[0x15] = 0;
  local_1a8[0x16] = 0;
  local_1a8[0x17] = 0;
  local_1a8[0x18] = 0;
  local_1a8[0x19] = 0;
  local_1a8[0x1a] = 0;
  local_1a8[0x1b] = 0;
  local_1a8[0x1c] = 0;
  local_1a8[0x1d] = 0;
  local_1a8[0x1e] = 0;
  local_1a8[0x1f] = 0;
  local_1a8[0x20] = 0;
  local_1a8[0x21] = 0;
  local_1a8[0x22] = 0;
  local_1a8[0x23] = 0;
  local_1a8[0x24] = 0;
  local_1a8[0x25] = 0;
  local_1a8[0x26] = 0;
  local_1a8[0x27] = 0;
  local_1a8[0x28] = 0;
  local_1a8[0x29] = 0;
  local_1a8[0x2a] = 0;
  local_1a8[0x2b] = 0;
  local_1a8[0x2c] = 0;
  local_1a8[0x2d] = 0;
  local_1a8[0x2e] = 0;
  local_1a8[0x2f] = 0;
  local_1a8[0x30] = 0;
  local_1a8[0x31] = 0;
  local_1a8[0x32] = 0;
  local_1a8[0x33] = 0;
  local_1a8[0x34] = 0;
  local_1a8[0x35] = 0;
  local_1a8[0x36] = 0;
  local_1a8[0x37] = 0;
  local_1a8[0x38] = 0;
  local_1a8[0x39] = 0;
  local_1a8[0x3a] = 0;
  local_1a8[0x3b] = 0;
  local_1a8[0x3c] = 0;
  local_1a8[0x3d] = 0;
  local_1a8[0x3e] = 0;
  local_1a8[0x3f] = 0;
  local_168[0x100] = '\0';
  local_168[0x101] = '\0';
  local_168[0x102] = '\0';
  local_168[0x103] = '\0';
  local_168[0x104] = '\0';
  local_168[0x105] = '\0';
  local_168[0x106] = '\0';
  local_168[0x107] = '\0';
  local_168[0x108] = '\0';
  local_168[0x109] = '\0';
  local_168[0x10a] = '\0';
  local_168[0x10b] = '\0';
  local_168[0x10c] = '\0';
  local_168[0x10d] = '\0';
  local_168[0x10e] = '\0';
  local_168[0x10f] = '\0';
  local_168[0x110] = '\0';
  local_168[0x111] = '\0';
  local_168[0x112] = '\0';
  local_168[0x113] = '\0';
  local_168[0x114] = '\0';
  local_168[0x115] = '\0';
  local_168[0x116] = '\0';
  local_168[0x117] = '\0';
  local_168[0x118] = '\0';
  local_168[0x119] = '\0';
  local_168[0x11a] = '\0';
  local_168[0x11b] = '\0';
  local_168[0x11c] = '\0';
  local_168[0x11d] = '\0';
  local_168[0x11e] = '\0';
  local_168[0x11f] = '\0';
  local_168[0x120] = '\0';
  local_168[0x121] = '\0';
  local_168[0x122] = '\0';
  local_168[0x123] = '\0';
  local_168[0x124] = '\0';
  local_168[0x125] = '\0';
  local_168[0x126] = '\0';
  local_168[0x127] = '\0';
  local_168[0x128] = '\0';
  local_168[0x129] = '\0';
  local_168[0x12a] = '\0';
  local_168[299] = '\0';
  local_168[300] = '\0';
  local_168[0x12d] = '\0';
  local_168[0x12e] = '\0';
  local_168[0x12f] = '\0';
  local_168[0x130] = '\0';
  local_168[0x131] = '\0';
  local_168[0x132] = '\0';
  local_168[0x133] = '\0';
  local_168[0x134] = '\0';
  local_168[0x135] = '\0';
  local_168[0x136] = '\0';
  local_168[0x137] = '\0';
  local_168[0x138] = '\0';
  local_168[0x139] = '\0';
  local_168[0x13a] = '\0';
  local_168[0x13b] = '\0';
  local_168[0x13c] = '\0';
  local_168[0x13d] = '\0';
  local_168[0x13e] = '\0';
  local_168[0x13f] = '\0';
  local_168[0xc0] = '\0';
  local_168[0xc1] = '\0';
  local_168[0xc2] = '\0';
  local_168[0xc3] = '\0';
  local_168[0xc4] = '\0';
  local_168[0xc5] = '\0';
  local_168[0xc6] = '\0';
  local_168[199] = '\0';
  local_168[200] = '\0';
  local_168[0xc9] = '\0';
  local_168[0xca] = '\0';
  local_168[0xcb] = '\0';
  local_168[0xcc] = '\0';
  local_168[0xcd] = '\0';
  local_168[0xce] = '\0';
  local_168[0xcf] = '\0';
  local_168[0xd0] = '\0';
  local_168[0xd1] = '\0';
  local_168[0xd2] = '\0';
  local_168[0xd3] = '\0';
  local_168[0xd4] = '\0';
  local_168[0xd5] = '\0';
  local_168[0xd6] = '\0';
  local_168[0xd7] = '\0';
  local_168[0xd8] = '\0';
  local_168[0xd9] = '\0';
  local_168[0xda] = '\0';
  local_168[0xdb] = '\0';
  local_168[0xdc] = '\0';
  local_168[0xdd] = '\0';
  local_168[0xde] = '\0';
  local_168[0xdf] = '\0';
  local_168[0xe0] = '\0';
  local_168[0xe1] = '\0';
  local_168[0xe2] = '\0';
  local_168[0xe3] = '\0';
  local_168[0xe4] = '\0';
  local_168[0xe5] = '\0';
  local_168[0xe6] = '\0';
  local_168[0xe7] = '\0';
  local_168[0xe8] = '\0';
  local_168[0xe9] = '\0';
  local_168[0xea] = '\0';
  local_168[0xeb] = '\0';
  local_168[0xec] = '\0';
  local_168[0xed] = '\0';
  local_168[0xee] = '\0';
  local_168[0xef] = '\0';
  local_168[0xf0] = '\0';
  local_168[0xf1] = '\0';
  local_168[0xf2] = '\0';
  local_168[0xf3] = '\0';
  local_168[0xf4] = '\0';
  local_168[0xf5] = '\0';
  local_168[0xf6] = '\0';
  local_168[0xf7] = '\0';
  local_168[0xf8] = '\0';
  local_168[0xf9] = '\0';
  local_168[0xfa] = '\0';
  local_168[0xfb] = '\0';
  local_168[0xfc] = '\0';
  local_168[0xfd] = '\0';
  local_168[0xfe] = '\0';
  local_168[0xff] = '\0';
  local_168[0x80] = '\0';
  local_168[0x81] = '\0';
  local_168[0x82] = '\0';
  local_168[0x83] = '\0';
  local_168[0x84] = '\0';
  local_168[0x85] = '\0';
  local_168[0x86] = '\0';
  local_168[0x87] = '\0';
  local_168[0x88] = '\0';
  local_168[0x89] = '\0';
  local_168[0x8a] = '\0';
  local_168[0x8b] = '\0';
  local_168[0x8c] = '\0';
  local_168[0x8d] = '\0';
  local_168[0x8e] = '\0';
  local_168[0x8f] = '\0';
  local_168[0x90] = '\0';
  local_168[0x91] = '\0';
  local_168[0x92] = '\0';
  local_168[0x93] = '\0';
  local_168[0x94] = '\0';
  local_168[0x95] = '\0';
  local_168[0x96] = '\0';
  local_168[0x97] = '\0';
  local_168[0x98] = '\0';
  local_168[0x99] = '\0';
  local_168[0x9a] = '\0';
  local_168[0x9b] = '\0';
  local_168[0x9c] = '\0';
  local_168[0x9d] = '\0';
  local_168[0x9e] = '\0';
  local_168[0x9f] = '\0';
  local_168[0xa0] = '\0';
  local_168[0xa1] = '\0';
  local_168[0xa2] = '\0';
  local_168[0xa3] = '\0';
  local_168[0xa4] = '\0';
  local_168[0xa5] = '\0';
  local_168[0xa6] = '\0';
  local_168[0xa7] = '\0';
  local_168[0xa8] = '\0';
  local_168[0xa9] = '\0';
  local_168[0xaa] = '\0';
  local_168[0xab] = '\0';
  local_168[0xac] = '\0';
  local_168[0xad] = '\0';
  local_168[0xae] = '\0';
  local_168[0xaf] = '\0';
  local_168[0xb0] = '\0';
  local_168[0xb1] = '\0';
  local_168[0xb2] = '\0';
  local_168[0xb3] = '\0';
  local_168[0xb4] = '\0';
  local_168[0xb5] = '\0';
  local_168[0xb6] = '\0';
  local_168[0xb7] = '\0';
  local_168[0xb8] = '\0';
  local_168[0xb9] = '\0';
  local_168[0xba] = '\0';
  local_168[0xbb] = '\0';
  local_168[0xbc] = '\0';
  local_168[0xbd] = '\0';
  local_168[0xbe] = '\0';
  local_168[0xbf] = '\0';
  local_168[0x70] = '\0';
  local_168[0x71] = '\0';
  local_168[0x72] = '\0';
  local_168[0x73] = '\0';
  local_168[0x74] = '\0';
  local_168[0x75] = '\0';
  local_168[0x76] = '\0';
  local_168[0x77] = '\0';
  local_168[0x78] = '\0';
  local_168[0x79] = '\0';
  local_168[0x7a] = '\0';
  local_168[0x7b] = '\0';
  local_168[0x7c] = '\0';
  local_168[0x7d] = '\0';
  local_168[0x7e] = '\0';
  local_168[0x7f] = '\0';
  local_168[0x60] = '\0';
  local_168[0x61] = '\0';
  local_168[0x62] = '\0';
  local_168[99] = '\0';
  local_168[100] = '\0';
  local_168[0x65] = '\0';
  local_168[0x66] = '\0';
  local_168[0x67] = '\0';
  local_168[0x68] = '\0';
  local_168[0x69] = '\0';
  local_168[0x6a] = '\0';
  local_168[0x6b] = '\0';
  local_168[0x6c] = '\0';
  local_168[0x6d] = '\0';
  local_168[0x6e] = '\0';
  local_168[0x6f] = '\0';
  local_168[0x50] = '\0';
  local_168[0x51] = '\0';
  local_168[0x52] = '\0';
  local_168[0x53] = '\0';
  local_168[0x54] = '\0';
  local_168[0x55] = '\0';
  local_168[0x56] = '\0';
  local_168[0x57] = '\0';
  local_168[0x58] = '\0';
  local_168[0x59] = '\0';
  local_168[0x5a] = '\0';
  local_168[0x5b] = '\0';
  local_168[0x5c] = '\0';
  local_168[0x5d] = '\0';
  local_168[0x5e] = '\0';
  local_168[0x5f] = '\0';
  local_168[0x40] = '\0';
  local_168[0x41] = '\0';
  local_168[0x42] = '\0';
  local_168[0x43] = '\0';
  local_168[0x44] = '\0';
  local_168[0x45] = '\0';
  local_168[0x46] = '\0';
  local_168[0x47] = '\0';
  local_168[0x48] = '\0';
  local_168[0x49] = '\0';
  local_168[0x4a] = '\0';
  local_168[0x4b] = '\0';
  local_168[0x4c] = '\0';
  local_168[0x4d] = '\0';
  local_168[0x4e] = '\0';
  local_168[0x4f] = '\0';
  local_168[0] = '\0';
  local_168[1] = '\0';
  local_168[2] = '\0';
  local_168[3] = '\0';
  local_168[4] = '\0';
  local_168[5] = '\0';
  local_168[6] = '\0';
  local_168[7] = '\0';
  local_168[8] = '\0';
  local_168[9] = '\0';
  local_168[10] = '\0';
  local_168[0xb] = '\0';
  local_168[0xc] = '\0';
  local_168[0xd] = '\0';
  local_168[0xe] = '\0';
  local_168[0xf] = '\0';
  local_168[0x10] = '\0';
  local_168[0x11] = '\0';
  local_168[0x12] = '\0';
  local_168[0x13] = '\0';
  local_168[0x14] = '\0';
  local_168[0x15] = '\0';
  local_168[0x16] = '\0';
  local_168[0x17] = '\0';
  local_168[0x18] = '\0';
  local_168[0x19] = '\0';
  local_168[0x1a] = '\0';
  local_168[0x1b] = '\0';
  local_168[0x1c] = '\0';
  local_168[0x1d] = '\0';
  local_168[0x1e] = '\0';
  local_168[0x1f] = '\0';
  local_168[0x20] = '\0';
  local_168[0x21] = '\0';
  local_168[0x22] = '\0';
  local_168[0x23] = '\0';
  local_168[0x24] = '\0';
  local_168[0x25] = '\0';
  local_168[0x26] = '\0';
  local_168[0x27] = '\0';
  local_168[0x28] = '\0';
  local_168[0x29] = '\0';
  local_168[0x2a] = '\0';
  local_168[0x2b] = '\0';
  local_168[0x2c] = '\0';
  local_168[0x2d] = '\0';
  local_168[0x2e] = '\0';
  local_168[0x2f] = '\0';
  local_168[0x30] = '\0';
  local_168[0x31] = '\0';
  local_168[0x32] = '\0';
  local_168[0x33] = '\0';
  local_168[0x34] = '\0';
  local_168[0x35] = '\0';
  local_168[0x36] = '\0';
  local_168[0x37] = '\0';
  local_168[0x38] = '\0';
  local_168[0x39] = '\0';
  local_168[0x3a] = '\0';
  local_168[0x3b] = '\0';
  local_168[0x3c] = '\0';
  local_168[0x3d] = '\0';
  local_168[0x3e] = '\0';
  local_168[0x3f] = '\0';
  n = dumbfile_igetw(f);
  iVar2 = dumbfile_igetw(f);
  pattern->n_rows = iVar2;
  dumbfile_skip(f,4);
  iVar2 = dumbfile_error(f);
  iVar8 = -1;
  if (iVar2 == 0) {
    dumbfile_getnc((char *)buffer,n,f);
    iVar2 = dumbfile_error(f);
    if (iVar2 == 0) {
      iVar2 = 0;
      if (0 < n) {
        iVar4 = 0;
        do {
          uVar1 = buffer[iVar4];
          uVar5 = (long)iVar4 + 1;
          if (uVar1 == '\0') {
            iVar2 = iVar2 + 1;
          }
          else {
            uVar7 = (byte)(uVar1 - 1) & 0x3f;
            if ((char)uVar1 < '\0') {
              bVar6 = buffer[uVar5];
              local_1a8[uVar7] = bVar6;
              uVar5 = (ulong)(iVar4 + 2);
            }
            else {
              bVar6 = local_1a8[uVar7];
            }
            iVar2 = (iVar2 + 1) - (uint)(bVar6 == 0);
            uVar5 = (ulong)((uint)""[bVar6 & 0xf] + (int)uVar5);
          }
          iVar4 = (int)uVar5;
        } while (iVar4 < n);
      }
      pattern->n_entries = iVar2;
      pIVar3 = (IT_ENTRY *)malloc((long)iVar2 * 7);
      pattern->entry = pIVar3;
      if (pIVar3 != (IT_ENTRY *)0x0) {
        local_1a8[0x30] = 0;
        local_1a8[0x31] = 0;
        local_1a8[0x32] = 0;
        local_1a8[0x33] = 0;
        local_1a8[0x34] = 0;
        local_1a8[0x35] = 0;
        local_1a8[0x36] = 0;
        local_1a8[0x37] = 0;
        local_1a8[0x38] = 0;
        local_1a8[0x39] = 0;
        local_1a8[0x3a] = 0;
        local_1a8[0x3b] = 0;
        local_1a8[0x3c] = 0;
        local_1a8[0x3d] = 0;
        local_1a8[0x3e] = 0;
        local_1a8[0x3f] = 0;
        local_1a8[0x20] = 0;
        local_1a8[0x21] = 0;
        local_1a8[0x22] = 0;
        local_1a8[0x23] = 0;
        local_1a8[0x24] = 0;
        local_1a8[0x25] = 0;
        local_1a8[0x26] = 0;
        local_1a8[0x27] = 0;
        local_1a8[0x28] = 0;
        local_1a8[0x29] = 0;
        local_1a8[0x2a] = 0;
        local_1a8[0x2b] = 0;
        local_1a8[0x2c] = 0;
        local_1a8[0x2d] = 0;
        local_1a8[0x2e] = 0;
        local_1a8[0x2f] = 0;
        local_1a8[0x10] = 0;
        local_1a8[0x11] = 0;
        local_1a8[0x12] = 0;
        local_1a8[0x13] = 0;
        local_1a8[0x14] = 0;
        local_1a8[0x15] = 0;
        local_1a8[0x16] = 0;
        local_1a8[0x17] = 0;
        local_1a8[0x18] = 0;
        local_1a8[0x19] = 0;
        local_1a8[0x1a] = 0;
        local_1a8[0x1b] = 0;
        local_1a8[0x1c] = 0;
        local_1a8[0x1d] = 0;
        local_1a8[0x1e] = 0;
        local_1a8[0x1f] = 0;
        local_1a8[0] = 0;
        local_1a8[1] = 0;
        local_1a8[2] = 0;
        local_1a8[3] = 0;
        local_1a8[4] = 0;
        local_1a8[5] = 0;
        local_1a8[6] = 0;
        local_1a8[7] = 0;
        local_1a8[8] = 0;
        local_1a8[9] = 0;
        local_1a8[10] = 0;
        local_1a8[0xb] = 0;
        local_1a8[0xc] = 0;
        local_1a8[0xd] = 0;
        local_1a8[0xe] = 0;
        local_1a8[0xf] = 0;
        if (0 < n) {
          iVar2 = 0;
          do {
            uVar1 = buffer[iVar2];
            uVar5 = (long)iVar2 + 1;
            if (uVar1 == '\0') {
              pIVar3->channel = 0xff;
LAB_0071d109:
              iVar2 = (int)uVar5;
              pIVar3 = pIVar3 + 1;
            }
            else {
              uVar7 = (byte)(uVar1 - 1) & 0x3f;
              if ((char)uVar1 < '\0') {
                bVar6 = buffer[uVar5];
                local_1a8[uVar7] = bVar6;
                uVar5 = (ulong)(iVar2 + 2);
              }
              else {
                bVar6 = local_1a8[uVar7];
              }
              iVar2 = (int)uVar5;
              if (bVar6 != 0) {
                pIVar3->mask = bVar6 >> 4 | bVar6 & 0xf;
                pIVar3->channel = (uchar)uVar7;
                if ((bVar6 & 1) == 0) {
                  if ((bVar6 & 0x10) != 0) {
                    pIVar3->note = local_168[(ulong)uVar7 + 0x100];
                  }
                }
                else {
                  uVar5 = (ulong)(iVar2 + 1);
                  uVar1 = buffer[iVar2];
                  pIVar3->note = uVar1;
                  local_168[(ulong)uVar7 + 0x100] = uVar1;
                }
                if ((bVar6 & 2) == 0) {
                  if ((bVar6 & 0x20) != 0) {
                    pIVar3->instrument = local_168[(ulong)uVar7 + 0xc0];
                  }
                }
                else {
                  iVar2 = (int)uVar5;
                  uVar5 = (ulong)(iVar2 + 1);
                  uVar1 = buffer[iVar2];
                  pIVar3->instrument = uVar1;
                  local_168[(ulong)uVar7 + 0xc0] = uVar1;
                }
                if ((bVar6 & 4) == 0) {
                  if ((bVar6 & 0x40) != 0) {
                    pIVar3->volpan = local_168[(ulong)uVar7 + 0x80];
                  }
                }
                else {
                  iVar2 = (int)uVar5;
                  uVar5 = (ulong)(iVar2 + 1);
                  uVar1 = buffer[iVar2];
                  pIVar3->volpan = uVar1;
                  local_168[(ulong)uVar7 + 0x80] = uVar1;
                }
                if ((bVar6 & 8) == 0) {
                  pIVar3->effect = local_168[(ulong)uVar7 + 0x40];
                  pIVar3->effectvalue = local_168[uVar7];
                }
                else {
                  iVar2 = (int)uVar5;
                  uVar1 = buffer[iVar2];
                  pIVar3->effect = uVar1;
                  local_168[(ulong)uVar7 + 0x40] = uVar1;
                  uVar5 = (ulong)(iVar2 + 2);
                  uVar1 = buffer[(long)iVar2 + 1];
                  pIVar3->effectvalue = uVar1;
                  local_168[uVar7] = uVar1;
                }
                goto LAB_0071d109;
              }
            }
          } while (iVar2 < n);
        }
        iVar8 = 0;
      }
    }
  }
  return iVar8;
}

Assistant:

static int it_read_pattern(IT_PATTERN *pattern, DUMBFILE *f, unsigned char *buffer)
{
	unsigned char cmask[DUMB_IT_N_CHANNELS];
	unsigned char cnote[DUMB_IT_N_CHANNELS];
	unsigned char cinstrument[DUMB_IT_N_CHANNELS];
	unsigned char cvolpan[DUMB_IT_N_CHANNELS];
	unsigned char ceffect[DUMB_IT_N_CHANNELS];
	unsigned char ceffectvalue[DUMB_IT_N_CHANNELS];
#ifdef DETECT_DUPLICATE_CHANNELS
	IT_ENTRY *dupentry[DUMB_IT_N_CHANNELS];
#endif

	int n_entries = 0;
	int buflen;
	int bufpos = 0;

	IT_ENTRY *entry;

	unsigned char channel;
	unsigned char mask;

	memset(cmask, 0, sizeof(cmask));
	memset(cnote, 0, sizeof(cnote));
	memset(cinstrument, 0, sizeof(cinstrument));
	memset(cvolpan, 0, sizeof(cvolpan));
	memset(ceffect, 0, sizeof(ceffect));
	memset(ceffectvalue, 0, sizeof(ceffectvalue));
#ifdef DETECT_DUPLICATE_CHANNELS
	{
		int i;
		for (i = 0; i < DUMB_IT_N_CHANNELS; i++) dupentry[i] = NULL;
	}
#endif

	buflen = dumbfile_igetw(f);
	pattern->n_rows = dumbfile_igetw(f);

	/* Skip four unused bytes. */
	dumbfile_skip(f, 4);

	if (dumbfile_error(f))
		return -1;

	/* Read in the pattern data. */
    dumbfile_getnc((char *)buffer, buflen, f);

	if (dumbfile_error(f))
		return -1;

	/* Scan the pattern data, and work out how many entries we need room for. */
	while (bufpos < buflen) {
		unsigned char b = buffer[bufpos++];

		if (b == 0) {
			/* End of row */
			n_entries++;
			continue;
		}

		channel = (b - 1) & 63;

		if (b & 128)
			cmask[channel] = mask = buffer[bufpos++];
		else
			mask = cmask[channel];

		{
			static const unsigned char used[16] = {0, 1, 1, 2, 1, 2, 2, 3, 2, 3, 3, 4, 3, 4, 4, 5};
			n_entries += (mask != 0);
			bufpos += used[mask & 15];
		}
	}

	pattern->n_entries = n_entries;

	pattern->entry = malloc(n_entries * sizeof(*pattern->entry));

	if (!pattern->entry)
		return -1;

	bufpos = 0;
	memset(cmask, 0, sizeof(cmask));

	entry = pattern->entry;

	while (bufpos < buflen) {
		unsigned char b = buffer[bufpos++];

		if (b == 0) {
			/* End of row */
			IT_SET_END_ROW(entry);
			entry++;
#ifdef DETECT_DUPLICATE_CHANNELS
			{
				int i;
				for (i = 0; i < DUMB_IT_N_CHANNELS; i++) dupentry[i] = NULL;
			}
#endif
			continue;
		}

		channel = (b - 1) & 63;

		if (b & 128)
			cmask[channel] = mask = buffer[bufpos++];
		else
			mask = cmask[channel];

		if (mask) {
			entry->mask = (mask & 15) | (mask >> 4);
			entry->channel = channel;

			if (mask & IT_ENTRY_NOTE)
				cnote[channel] = entry->note = buffer[bufpos++];
			else if (mask & (IT_ENTRY_NOTE << 4))
				entry->note = cnote[channel];

			if (mask & IT_ENTRY_INSTRUMENT)
				cinstrument[channel] = entry->instrument = buffer[bufpos++];
			else if (mask & (IT_ENTRY_INSTRUMENT << 4))
				entry->instrument = cinstrument[channel];

			if (mask & IT_ENTRY_VOLPAN)
				cvolpan[channel] = entry->volpan = buffer[bufpos++];
			else if (mask & (IT_ENTRY_VOLPAN << 4))
				entry->volpan = cvolpan[channel];

			if (mask & IT_ENTRY_EFFECT) {
				ceffect[channel] = entry->effect = buffer[bufpos++];
				ceffectvalue[channel] = entry->effectvalue = buffer[bufpos++];
			} else {
				entry->effect = ceffect[channel];
				entry->effectvalue = ceffectvalue[channel];
			}

#ifdef DETECT_DUPLICATE_CHANNELS
			if (dupentry[channel]) {
				FILE *f = fopen("dupentry.txt", "a");
				if (!f) abort();
				fprintf(f, "Two events on channel %d:", channel);
				fprintf(f, "  Event #1:");
				if (dupentry[channel]->mask & IT_ENTRY_NOTE      ) fprintf(f, " %03d", dupentry[channel]->note      ); else fprintf(f, " ...");
				if (dupentry[channel]->mask & IT_ENTRY_INSTRUMENT) fprintf(f, " %03d", dupentry[channel]->instrument); else fprintf(f, " ...");
				if (dupentry[channel]->mask & IT_ENTRY_VOLPAN    ) fprintf(f, " %03d", dupentry[channel]->volpan    ); else fprintf(f, " ...");
				if (dupentry[channel]->mask & IT_ENTRY_EFFECT) fprintf(f, " %c%02X\n", 'A' - 1 + dupentry[channel]->effect, dupentry[channel]->effectvalue); else fprintf(f, " ...\n");
				fprintf(f, "  Event #2:");
				if (entry->mask & IT_ENTRY_NOTE      ) fprintf(f, " %03d", entry->note      ); else fprintf(f, " ...");
				if (entry->mask & IT_ENTRY_INSTRUMENT) fprintf(f, " %03d", entry->instrument); else fprintf(f, " ...");
				if (entry->mask & IT_ENTRY_VOLPAN    ) fprintf(f, " %03d", entry->volpan    ); else fprintf(f, " ...");
				if (entry->mask & IT_ENTRY_EFFECT) fprintf(f, " %c%02X\n", 'A' - 1 + entry->effect, entry->effectvalue); else fprintf(f, " ...\n");
				fclose(f);
			}
			dupentry[channel] = entry;
#endif

			entry++;
		}
	}

	ASSERT(entry == pattern->entry + n_entries);

	return 0;
}